

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

DebugContext * __thiscall Js::ScriptContext::GetDebugContext(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugContext *pDVar4;
  DebugContext *pDVar5;
  
  pDVar5 = this->debugContext;
  if (pDVar5 == (DebugContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x191a,"(this->debugContext != nullptr)",
                                "this->debugContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar5 = this->debugContext;
  }
  pDVar4 = (DebugContext *)0x0;
  if ((pDVar5->field_0x1c & 1) == 0) {
    pDVar4 = pDVar5;
  }
  return pDVar4;
}

Assistant:

DebugContext* ScriptContext::GetDebugContext() const
    {
        Assert(this->debugContext != nullptr);

        if (this->debugContext->IsClosed())
        {
            // Once DebugContext is closed we should assume it's not there
            // The actual deletion of debugContext happens in ScriptContext destructor
            return nullptr;
        }

        return this->debugContext;
    }